

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPDeviceClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDeviceClause *this)

{
  string clause_string;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"device ","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"(","");
  if ((this->modifier == OMPC_DEVICE_MODIFIER_ancestor) ||
     (this->modifier == OMPC_DEVICE_MODIFIER_device_num)) {
    std::__cxx11::string::append((char *)&local_60);
  }
  if (1 < local_58) {
    std::__cxx11::string::append((char *)&local_60);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_40,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_60);
  if (3 < local_58) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDeviceClause::toString() {

    std::string result = "device ";
    std::string clause_string = "(";
    OpenMPDeviceClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_DEVICE_MODIFIER_ancestor:
            clause_string += "ancestor";
            break;
        case OMPC_DEVICE_MODIFIER_device_num:
            clause_string += "device_num";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}